

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<char> * __thiscall irr::core::string<char>::operator=(string<char> *this,unsigned_short *c)

{
  s32 l;
  char *pcVar1;
  long lVar2;
  unsigned_short *puVar3;
  ulong uVar4;
  bool bVar5;
  
  puVar3 = (unsigned_short *)this->array;
  if (c == (unsigned_short *)0x0) {
    if (puVar3 == (unsigned_short *)0x0) {
      puVar3 = (unsigned_short *)operator_new__(1);
      this->array = (char *)puVar3;
      this->allocated = 1;
      this->used = 1;
    }
    *(undefined1 *)puVar3 = 0;
  }
  else if (puVar3 != c) {
    for (uVar4 = 1; c[uVar4 - 1] != 0; uVar4 = uVar4 + 1) {
    }
    this->used = (s32)uVar4;
    this->allocated = (s32)uVar4;
    pcVar1 = (char *)operator_new__(uVar4);
    this->array = pcVar1;
    lVar2 = 0;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      this->array[lVar2] = (char)c[lVar2];
      lVar2 = lVar2 + 1;
    }
    if (puVar3 != (unsigned_short *)0x0) {
      operator_delete__(puVar3);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}